

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnView::setRootIndex(QColumnView *this,QModelIndex *index)

{
  QColumnViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QAbstractItemView *this_01;
  QItemSelectionModel *pQVar2;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QColumnViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar1 != (QAbstractItemModel *)0x0) {
    local_40.r = -1;
    local_40.c = -1;
    local_40.i = 0;
    local_40.m.ptr = (QAbstractItemModel *)0x0;
    QColumnViewPrivate::closeColumns(this_00,&local_40,false);
    this_01 = (QAbstractItemView *)QColumnViewPrivate::createColumn(this_00,index,true);
    pQVar2 = QAbstractItemView::selectionModel(this_01);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      QAbstractItemView::selectionModel(this_01);
      QObject::deleteLater();
    }
    pQVar1 = QAbstractItemView::model(this_01);
    if (pQVar1 != (QAbstractItemModel *)0x0) {
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      (**(code **)(*(long *)this_01 + 0x1d0))(this_01,pQVar2);
    }
    QAbstractItemView::setRootIndex((QAbstractItemView *)this,index);
    QColumnViewPrivate::updateScrollbars(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::setRootIndex(const QModelIndex &index)
{
    Q_D(QColumnView);
    if (!model())
        return;

    d->closeColumns();
    Q_ASSERT(d->columns.size() == 0);

    QAbstractItemView *view = d->createColumn(index, true);
    if (view->selectionModel())
        view->selectionModel()->deleteLater();
    if (view->model())
        view->setSelectionModel(selectionModel());

    QAbstractItemView::setRootIndex(index);
    d->updateScrollbars();
}